

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

void deqp::gls::AttributeLocationTestUtil::runTest
               (TestContext *testCtx,RenderContext *renderCtx,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *attributes,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preAttachBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preLinkBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *postLinkBind,bool relink,bool reattach,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *reattachAttributes)

{
  mapped_type_conflict mVar1;
  int iVar2;
  TestLog *log;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  GLuint program;
  GLenum GVar8;
  undefined4 extraout_var;
  mapped_type_conflict *pmVar9;
  undefined8 *puVar10;
  pair<unsigned_int,_unsigned_int> pVar11;
  TestError *this;
  long *plVar12;
  long *plVar13;
  char *description;
  ostringstream *poVar14;
  pointer pBVar15;
  long lVar16;
  pointer pAVar17;
  long lVar18;
  ScopedLogSection section;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  activeBindings;
  deInt32 status;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  undefined8 uStack_3d0;
  RenderContext *local_3c8;
  TestContext *local_3c0;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *local_3b8;
  ScopedLogSection local_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  undefined8 local_388;
  TestLog *local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_378;
  long *local_348 [2];
  long local_338 [2];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  Functions *gl;
  
  log = testCtx->m_log;
  local_3c8 = renderCtx;
  local_3c0 = testCtx;
  iVar7 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  local_378._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_378._M_impl.super__Rb_tree_header._M_header;
  local_378._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_378._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_378._M_impl.super__Rb_tree_header._M_node_count = 0;
  pBVar15 = (preAttachBind->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_378._M_impl.super__Rb_tree_header._M_header._M_right =
       local_378._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)(preAttachBind->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar15) >> 3) *
          -0x33333333) {
    lVar16 = 0;
    lVar18 = 0;
    do {
      mVar1 = *(mapped_type_conflict *)((long)&pBVar15->m_location + lVar16);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)&local_378,
                            (key_type *)((long)&(pBVar15->m_attribute)._M_dataplus._M_p + lVar16));
      *pmVar9 = mVar1;
      lVar18 = lVar18 + 1;
      pBVar15 = (preAttachBind->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x28;
    } while (lVar18 < (int)((ulong)((long)(preAttachBind->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar15) >> 3) * -0x33333333);
  }
  pBVar15 = (preLinkBind->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(preLinkBind->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar15) >> 3) *
          -0x33333333) {
    lVar16 = 0;
    lVar18 = 0;
    do {
      mVar1 = *(mapped_type_conflict *)((long)&pBVar15->m_location + lVar16);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)&local_378,
                            (key_type *)((long)&(pBVar15->m_attribute)._M_dataplus._M_p + lVar16));
      *pmVar9 = mVar1;
      lVar18 = lVar18 + 1;
      pBVar15 = (preLinkBind->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x28;
    } while (lVar18 < (int)((ulong)((long)(preLinkBind->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar15) >> 3) * -0x33333333);
  }
  local_328._0_8_ = (TestLog *)(local_328 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Attributes","");
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Attribute information","");
  tcu::ScopedLogSection::ScopedLogSection(&local_3b0,log,(string *)local_328,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_328._0_8_ != (TestLog *)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_,local_318[0]._M_allocated_capacity + 1);
  }
  pAVar17 = (attributes->
            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_3b8 = attributes;
  if (0 < (int)((ulong)((long)(attributes->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar17) >> 7)) {
    local_380 = local_3c0->m_log;
    lVar16 = 0x48;
    lVar18 = 0;
    do {
      poVar14 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = local_380;
      std::__cxx11::ostringstream::ostringstream(poVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"Type: ",6);
      local_3a8 = local_398;
      lVar3 = *(long *)((long)pAVar17 + lVar16 + -0x48);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3a8,lVar3,*(long *)((long)pAVar17 + lVar16 + -0x40) + lVar3);
      local_388 = *(undefined8 *)((long)pAVar17 + lVar16 + -0x28);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar14,(char *)local_3a8,local_3a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,", Name: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar14,*(char **)((long)pAVar17 + lVar16 + -0x20),
                 *(long *)((long)pAVar17 + lVar16 + -0x18));
      iVar7 = *(int *)((long)&(pAVar17->m_type).m_name._M_dataplus._M_p + lVar16);
      local_3e8 = &local_3d8;
      if (iVar7 == -1) {
        plVar13 = &local_3e0;
        plVar12 = &local_3d8;
      }
      else {
        iVar2 = *(int *)((long)&(pAVar17->m_type).m_name._M_dataplus._M_p + lVar16);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,iVar2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x687b05);
        plVar12 = puVar10 + 2;
        if ((long *)*puVar10 == plVar12) {
          local_3d8 = *plVar12;
          uStack_3d0 = puVar10[3];
        }
        else {
          local_3d8 = *plVar12;
          local_3e8 = (long *)*puVar10;
        }
        plVar13 = puVar10 + 1;
        local_3e0 = puVar10[1];
        *puVar10 = plVar12;
      }
      *plVar13 = 0;
      *(undefined1 *)plVar12 = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_328 + 8),(char *)local_3e8,local_3e0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      attributes = local_3b8;
      if ((iVar7 != -1) && (local_348[0] != local_338)) {
        operator_delete(local_348[0],local_338[0] + 1);
      }
      if (local_3a8 != local_398) {
        operator_delete(local_3a8,local_398[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_328 + 8));
      std::ios_base::~ios_base(local_2b0);
      lVar18 = lVar18 + 1;
      pAVar17 = (attributes->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x80;
    } while (lVar18 < (int)((ulong)((long)(attributes->
                                          super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pAVar17) >> 7));
  }
  tcu::TestLog::endSection(local_3b0.m_log);
  poVar14 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"Create program.",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar14);
  std::ios_base::~ios_base(local_2b0);
  program = (*gl->createProgram)();
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"glCreateProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2cf);
  if ((preAttachBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (preAttachBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    anon_unknown_1::bindAttributes(log,gl,program,preAttachBind);
  }
  poVar14 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar14,"Create and attach shaders to program.",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar14);
  std::ios_base::~ios_base(local_2b0);
  bVar4 = anon_unknown_1::hasAttributeAliasing
                    (attributes,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)&local_378);
  pVar11 = anon_unknown_1::createAndAttachShaders(log,local_3c8,program,attributes,bVar4);
  if ((preLinkBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (preLinkBind->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    anon_unknown_1::bindAttributes(log,gl,program,preLinkBind);
  }
  poVar14 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"Link program.",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar14);
  std::ios_base::~ios_base(local_2b0);
  (*gl->linkProgram)(program);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"glLinkProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2dd);
  anon_unknown_1::logProgram(log,gl,program);
  (*gl->getProgramiv)(program,0x8b82,(GLint *)local_328);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"glGetProgramiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x162);
  if (local_328._0_4_ == 1) {
    bVar5 = anon_unknown_1::checkQuery
                      (log,gl,program,attributes,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)&local_378);
    bVar4 = bVar5;
    if ((postLinkBind->
        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (postLinkBind->
        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      anon_unknown_1::bindAttributes(log,gl,program,postLinkBind);
      bVar6 = anon_unknown_1::checkQuery
                        (log,gl,program,attributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      bVar4 = false;
      if (bVar6) {
        bVar4 = bVar5;
      }
    }
    bVar5 = bVar4;
    if (relink) {
      poVar14 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"Relink program.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar14);
      std::ios_base::~ios_base(local_2b0);
      (*gl->linkProgram)(program);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glLinkProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x2f1);
      anon_unknown_1::logProgram(log,gl,program);
      (*gl->getProgramiv)(program,0x8b82,(GLint *)local_328);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glGetProgramiv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x162);
      if (local_328._0_4_ != 1) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x2f4);
        goto LAB_004cb564;
      }
      pBVar15 = (postLinkBind->
                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(postLinkBind->
                                  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar15) >> 3)
              * -0x33333333) {
        lVar18 = 0;
        lVar16 = 0;
        do {
          mVar1 = *(mapped_type_conflict *)((long)&pBVar15->m_location + lVar18);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 *)&local_378,
                                (key_type *)
                                ((long)&(pBVar15->m_attribute)._M_dataplus._M_p + lVar18));
          *pmVar9 = mVar1;
          lVar16 = lVar16 + 1;
          pBVar15 = (postLinkBind->
                    super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x28;
        } while (lVar16 < (int)((ulong)((long)(postLinkBind->
                                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pBVar15) >> 3) * -0x33333333);
      }
      bVar6 = anon_unknown_1::checkQuery
                        (log,gl,program,local_3b8,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      bVar5 = false;
      if (bVar6) {
        bVar5 = bVar4;
      }
    }
    bVar4 = bVar5;
    if (reattach) {
      (*gl->detachShader)(program,pVar11.first);
      (*gl->detachShader)(program,pVar11.second);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glDetachShader()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x301);
      poVar14 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar14,"Create and attach shaders to program.",0x25);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar14);
      std::ios_base::~ios_base(local_2b0);
      bVar4 = anon_unknown_1::hasAttributeAliasing
                        (reattachAttributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      anon_unknown_1::createAndAttachShaders(log,local_3c8,program,reattachAttributes,bVar4);
      poVar14 = (ostringstream *)(local_328 + 8);
      local_328._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"Relink program.",0xf);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar14);
      std::ios_base::~ios_base(local_2b0);
      (*gl->linkProgram)(program);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glLinkProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x308);
      anon_unknown_1::logProgram(log,gl,program);
      (*gl->getProgramiv)(program,0x8b82,(GLint *)local_328);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glGetProgramiv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x162);
      if (local_328._0_4_ != 1) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x30b);
        goto LAB_004cb564;
      }
      bVar6 = anon_unknown_1::checkQuery
                        (log,gl,program,reattachAttributes,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&local_378);
      bVar4 = false;
      if (bVar6) {
        bVar4 = bVar5;
      }
    }
    (*gl->deleteProgram)(program);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"glDeleteProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x312);
    description = "Fail";
    if (bVar4 != false) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult(local_3c0,(uint)(bVar4 ^ 1),description);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_378);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Program link failed","getProgramLinkStatus(gl, program)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
             ,0x2e0);
LAB_004cb564:
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void runTest (tcu::TestContext&			testCtx,
			glu::RenderContext&			renderCtx,
			const vector<Attribute>&	attributes,
			const vector<Bind>&			preAttachBind,
			const vector<Bind>&			preLinkBind,
			const vector<Bind>&			postLinkBind,
			bool						relink,
			bool						reattach = false,
			const vector<Attribute>&	reattachAttributes = vector<Attribute>())
{
	TestLog&					log			= testCtx.getLog();
	const glw::Functions&		gl			= renderCtx.getFunctions();
	deUint32					program		= 0;
	pair<deUint32, deUint32>	shaders;

	try
	{
		bool					isOk			= true;
		map<string, deUint32>	activeBindings;

		for (int bindNdx = 0; bindNdx < (int)preAttachBind.size(); bindNdx++)
			activeBindings[preAttachBind[bindNdx].getAttributeName()] = preAttachBind[bindNdx].getLocation();

		for (int bindNdx = 0; bindNdx < (int)preLinkBind.size(); bindNdx++)
			activeBindings[preLinkBind[bindNdx].getAttributeName()] = preLinkBind[bindNdx].getLocation();

		{
			tcu::ScopedLogSection section(log, "Attributes", "Attribute information");
			logAttributes(testCtx.getLog(), attributes);
		}

		log << TestLog::Message << "Create program." << TestLog::EndMessage;
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram()");

		if (!preAttachBind.empty())
			bindAttributes(log, gl, program, preAttachBind);

		log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
		shaders = createAndAttachShaders(log, renderCtx, program, attributes, hasAttributeAliasing(attributes, activeBindings));

		if (!preLinkBind.empty())
			bindAttributes(log, gl, program, preLinkBind);

		log << TestLog::Message << "Link program." << TestLog::EndMessage;

		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

		logProgram(log, gl, program);
		TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

		if (!checkQuery(log, gl, program, attributes, activeBindings))
			isOk = false;

		if (!postLinkBind.empty())
		{
			bindAttributes(log, gl, program, postLinkBind);

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (relink)
		{
			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			for (int bindNdx = 0; bindNdx < (int)postLinkBind.size(); bindNdx++)
				activeBindings[postLinkBind[bindNdx].getAttributeName()] = postLinkBind[bindNdx].getLocation();

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (reattach)
		{
			gl.detachShader(program, shaders.first);
			gl.detachShader(program, shaders.second);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader()");

			log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
			createAndAttachShaders(log, renderCtx, program, reattachAttributes, hasAttributeAliasing(reattachAttributes, activeBindings));

			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			if (!checkQuery(log, gl, program, reattachAttributes, activeBindings))
				isOk = false;
		}

		gl.deleteProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (isOk)
			testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		throw;
	}
}